

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O2

void avro::codec_traits<testgen_r::RootRecord>::decode(Decoder *d,RootRecord *v)

{
  bool bVar1;
  int32_t iVar2;
  long *plVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  int64_t iVar4;
  pointer puVar5;
  Nested *v_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  plVar3 = (long *)__dynamic_cast(d,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  if (plVar3 == (long *)0x0) {
    iVar4 = (**(code **)(*(long *)d + 0x30))(d);
    v->mylong = iVar4;
    codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
    ::decode(d,&v->mymap);
    codec_traits<testgen_r::Nested>::decode(d,&v->nestedrecord);
    codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>_>
    ::decode(d,&v->recordmap);
    codec_traits<testgen_r::WithDefaultValue>::decode(d,&v->withDefaultValue);
    codec_traits<testgen_r::_bigrecord_r_Union__0__>::decode(d,&v->union1WithDefaultValue);
    codec_traits<testgen_r::_bigrecord_r_Union__1__>::decode(d,&v->union2WithDefaultValue);
    codec_traits<std::vector<double,_std::allocator<double>_>_>::decode(d,&v->myarray);
    codec_traits<testgen_r::ExampleEnum>::decode(d,&v->myenum);
    codec_traits<testgen_r::_bigrecord_r_Union__2__>::decode(d,&v->myunion);
    codec_traits<testgen_r::_bigrecord_r_Union__3__>::decode(d,&v->anotherunion);
    bVar1 = (bool)(**(code **)(*(long *)d + 0x20))(d);
    v->mybool = bVar1;
    codec_traits<testgen_r::Nested>::decode(d,&v->anothernested);
    codec_traits<testgen_r::RecordWithDefault>::decode(d,&v->rwd);
    codec_traits<boost::array<unsigned_char,_16UL>_>::decode(d,&v->myfixed);
    iVar2 = (**(code **)(*(long *)d + 0x28))(d);
    v->anotherint = iVar2;
    (**(code **)(*(long *)d + 0x58))(d,&v->bytes);
    return;
  }
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        (**(code **)(*plVar3 + 0xb8))(plVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,__x);
  puVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar5 == local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      return;
    }
    v_00 = &v->nestedrecord;
    switch(*puVar5) {
    case 0:
      iVar4 = (**(code **)(*(long *)d + 0x30))(d);
      v->mylong = iVar4;
      break;
    case 1:
      codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::decode(d,&v->mymap);
      break;
    case 3:
      codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen_r::Nested>_>_>_>
      ::decode(d,&v->recordmap);
      break;
    case 4:
      codec_traits<testgen_r::WithDefaultValue>::decode(d,&v->withDefaultValue);
      break;
    case 5:
      codec_traits<testgen_r::_bigrecord_r_Union__0__>::decode(d,&v->union1WithDefaultValue);
      break;
    case 6:
      codec_traits<testgen_r::_bigrecord_r_Union__1__>::decode(d,&v->union2WithDefaultValue);
      break;
    case 7:
      codec_traits<std::vector<double,_std::allocator<double>_>_>::decode(d,&v->myarray);
      break;
    case 8:
      codec_traits<testgen_r::ExampleEnum>::decode(d,&v->myenum);
      break;
    case 9:
      codec_traits<testgen_r::_bigrecord_r_Union__2__>::decode(d,&v->myunion);
      break;
    case 10:
      codec_traits<testgen_r::_bigrecord_r_Union__3__>::decode(d,&v->anotherunion);
      break;
    case 0xb:
      bVar1 = (bool)(**(code **)(*(long *)d + 0x20))(d);
      v->mybool = bVar1;
      break;
    case 0xc:
      v_00 = &v->anothernested;
    case 2:
      codec_traits<testgen_r::Nested>::decode(d,v_00);
      break;
    case 0xd:
      codec_traits<testgen_r::RecordWithDefault>::decode(d,&v->rwd);
      break;
    case 0xe:
      codec_traits<boost::array<unsigned_char,_16UL>_>::decode(d,&v->myfixed);
      break;
    case 0xf:
      iVar2 = (**(code **)(*(long *)d + 0x28))(d);
      v->anotherint = iVar2;
      break;
    case 0x10:
      (**(code **)(*(long *)d + 0x58))(d,&v->bytes);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

static void decode(Decoder& d, testgen_r::RootRecord& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.mylong);
                    break;
                case 1:
                    avro::decode(d, v.mymap);
                    break;
                case 2:
                    avro::decode(d, v.nestedrecord);
                    break;
                case 3:
                    avro::decode(d, v.recordmap);
                    break;
                case 4:
                    avro::decode(d, v.withDefaultValue);
                    break;
                case 5:
                    avro::decode(d, v.union1WithDefaultValue);
                    break;
                case 6:
                    avro::decode(d, v.union2WithDefaultValue);
                    break;
                case 7:
                    avro::decode(d, v.myarray);
                    break;
                case 8:
                    avro::decode(d, v.myenum);
                    break;
                case 9:
                    avro::decode(d, v.myunion);
                    break;
                case 10:
                    avro::decode(d, v.anotherunion);
                    break;
                case 11:
                    avro::decode(d, v.mybool);
                    break;
                case 12:
                    avro::decode(d, v.anothernested);
                    break;
                case 13:
                    avro::decode(d, v.rwd);
                    break;
                case 14:
                    avro::decode(d, v.myfixed);
                    break;
                case 15:
                    avro::decode(d, v.anotherint);
                    break;
                case 16:
                    avro::decode(d, v.bytes);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.mylong);
            avro::decode(d, v.mymap);
            avro::decode(d, v.nestedrecord);
            avro::decode(d, v.recordmap);
            avro::decode(d, v.withDefaultValue);
            avro::decode(d, v.union1WithDefaultValue);
            avro::decode(d, v.union2WithDefaultValue);
            avro::decode(d, v.myarray);
            avro::decode(d, v.myenum);
            avro::decode(d, v.myunion);
            avro::decode(d, v.anotherunion);
            avro::decode(d, v.mybool);
            avro::decode(d, v.anothernested);
            avro::decode(d, v.rwd);
            avro::decode(d, v.myfixed);
            avro::decode(d, v.anotherint);
            avro::decode(d, v.bytes);
        }
    }